

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

void __thiscall QCborStreamReaderPrivate::initDecoder(QCborStreamReaderPrivate *this)

{
  long lVar1;
  CborError CVar2;
  CborParser *in_RDI;
  long in_FS_OFFSET;
  QCborStreamReaderPrivate *unaff_retaddr;
  qsizetype in_stack_00000008;
  CborError err;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  CborParser *parser;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parser = in_RDI;
  QList<CborValue>::clear
            ((QList<CborValue> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  *(undefined8 *)&in_RDI[6].flags = 0;
  if ((in_RDI->source).end != (uint8_t *)0x0) {
    QByteArray::clear((QByteArray *)0x8d9acc);
    QByteArray::reserve((QByteArray *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                        in_stack_00000008);
  }
  preread(unaff_retaddr);
  CVar2 = cbor_parser_init_reader
                    ((CborParserOperations *)
                     CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),parser,
                     (CborValue *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_RDI);
  if (CVar2 == CborNoError) {
    *(undefined4 *)&in_RDI[6].source = 0;
  }
  else {
    handleError((QCborStreamReaderPrivate *)CONCAT44(CVar2,in_stack_ffffffffffffffe0),
                (CborError)((ulong)in_RDI >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void initDecoder()
    {
        containerStack.clear();
        bufferStart = 0;
        if (device) {
            buffer.clear();
            buffer.reserve(IdealIoBufferSize);      // sets the CapacityReserved flag
        }

        preread();
        if (CborError err = cbor_parser_init_reader(nullptr, &parser, &currentElement, this))
            handleError(err);
        else
            lastError = { QCborError::NoError };
    }